

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

void __thiscall sjtu::UserManager::logout(UserManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar3;
  int iVar4;
  pair<long,_bool> pVar5;
  long local_58;
  undefined1 local_50;
  hashType local_48;
  string local_40;
  long lVar2;
  
  this_00 = this->UserBpTree;
  std::__cxx11::string::string((string *)&local_40,(string *)(argv + 1));
  local_48 = StringHasher::operator()((StringHasher *)this,&local_40);
  pVar5 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_48);
  local_58 = pVar5.first;
  local_50 = pVar5.second;
  std::__cxx11::string::~string((string *)&local_40);
  iVar4 = -1;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    iVar1 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_58);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (*(uint *)(lVar2 + 0x6c) == this->online_flag) {
      *(undefined4 *)(lVar2 + 0x6c) = 0;
      (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                (this->UserFile,lVar2 + 0x78);
      iVar4 = 0;
    }
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void logout(int argc, std::string *argv) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(argv[1]));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (user->is_online == online_flag) {
                    user->is_online = 0;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;

        }